

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> __thiscall
immutable::rrb_push<immutable::vector<char,false,5>,true,5>
          (immutable *this,ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> *in,
          vector<char,_false,_5> *element)

{
  atomic<unsigned_int> *paVar1;
  tree_node<immutable::vector<char,_false,_5>,_true> *ptVar2;
  vector<char,_false,_5> *pvVar3;
  rrb<char,_false,_5> *prVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  rrb<immutable::vector<char,_false,_5>,_true,_5> *prVar9;
  rrb<immutable::vector<char,_false,_5>,_true,_5> *prVar10;
  leaf_node<immutable::vector<char,_false,_5>,_true> *plVar11;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> new_tail;
  ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> new_rrb;
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> local_50;
  ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> local_48;
  vector<char,_false,_5> local_40;
  ref<immutable::rrb<char,_false,_5>_> local_38;
  
  prVar9 = in->ptr;
  if (prVar9 != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
    if (prVar9->tail_len < 0x20) {
      local_40 = (vector<char,_false,_5>)(element->_impl).ptr;
      if (local_40._impl.ptr != (rrb<char,_false,_5> *)0x0) {
        ((rrb<char,_false,_5> *)local_40._impl.ptr)->_ref_count =
             ((rrb<char,_false,_5> *)local_40._impl.ptr)->_ref_count + 1;
      }
      prVar9 = rrb_details::rrb_tail_push<immutable::vector<char,false,5>,true,5>(in,&local_40);
      *(rrb<immutable::vector<char,_false,_5>,_true,_5> **)this = prVar9;
      if (prVar9 != (rrb<immutable::vector<char,_false,_5>,_true,_5> *)0x0) {
        LOCK();
        (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      ref<immutable::rrb<char,_false,_5>_>::~ref(&local_40._impl);
    }
    else {
      prVar10 = (rrb<immutable::vector<char,_false,_5>,_true,_5> *)malloc(0x28);
      uVar5 = prVar9->cnt;
      uVar6 = prVar9->shift;
      uVar7 = prVar9->tail_len;
      uVar8 = *(undefined4 *)&prVar9->field_0xc;
      ptVar2 = (prVar9->root).ptr;
      (prVar10->tail).ptr = (prVar9->tail).ptr;
      (prVar10->root).ptr = ptVar2;
      prVar10->cnt = uVar5;
      prVar10->shift = uVar6;
      prVar10->tail_len = uVar7;
      *(undefined4 *)&prVar10->field_0xc = uVar8;
      uVar8 = *(undefined4 *)&prVar9->field_0x24;
      prVar10->_ref_count =
           (__atomic_base<unsigned_int>)(prVar9->_ref_count).super___atomic_base<unsigned_int>;
      *(undefined4 *)&prVar10->field_0x24 = uVar8;
      ptVar2 = (prVar10->root).ptr;
      if (ptVar2 != (tree_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
        LOCK();
        paVar1 = &ptVar2->_ref_count;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      plVar11 = (prVar10->tail).ptr;
      if (plVar11 != (leaf_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
        LOCK();
        paVar1 = &plVar11->_ref_count;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      LOCK();
      (prVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      prVar10->cnt = prVar10->cnt + 1;
      local_48.ptr = prVar10;
      plVar11 = (leaf_node<immutable::vector<char,_false,_5>,_true> *)malloc(0x20);
      plVar11->type = LEAF_NODE;
      plVar11->len = 1;
      plVar11->child = (vector<char,_false,_5> *)(plVar11 + 1);
      plVar11->guid = 0;
      plVar11[1].type = LEAF_NODE;
      plVar11[1].len = 0;
      vector<char,_false,_5>::vector((vector<char,_false,_5> *)(plVar11 + 1));
      LOCK();
      (plVar11->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      pvVar3 = plVar11->child;
      prVar4 = (element->_impl).ptr;
      if (prVar4 != (rrb<char,_false,_5> *)0x0) {
        prVar4->_ref_count = prVar4->_ref_count + 1;
      }
      local_38.ptr = (pvVar3->_impl).ptr;
      (pvVar3->_impl).ptr = prVar4;
      local_50.ptr = plVar11;
      ref<immutable::rrb<char,_false,_5>_>::~ref(&local_38);
      prVar10->tail_len = 1;
      rrb_details::push_down_tail<immutable::vector<char,false,5>,true,5>
                ((rrb_details *)this,in,&local_48,&local_50);
      ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_>::~ref
                (&local_50);
      rrb_details::release<immutable::vector<char,false,5>,5>(local_48.ptr);
    }
    return (ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>)
           (rrb<immutable::vector<char,_false,_5>,_true,_5> *)this;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<immutable::vector<char, false>>>::operator->() const [T = immutable::rrb<immutable::vector<char, false>>]"
               );
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }